

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O2

string * __thiscall
gl3cts::GPUShader5ImplicitConversionsTest::getFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,GPUShader5ImplicitConversionsTest *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 130\n\nin  vec4 result;\nout vec4 color;\n\nvoid main()\n{\n    color = result;\n}\n\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShader5ImplicitConversionsTest::getFragmentShader()
{
	const char* fs_body_template = "#version 130\n"
								   "\n"
								   "in  vec4 result;\n"
								   "out vec4 color;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    color = result;\n"
								   "}\n"
								   "\n";

	std::string fs_body = fs_body_template;

	return fs_body;
}